

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simd_alignment_engine_implementation.hpp
# Opt level: O2

void __thiscall
spoa::SimdAlignmentEngine<(spoa::Architecture)3>::
Initialize<spoa::InstructionSet<(spoa::Architecture)3,int>>
          (SimdAlignmentEngine<(spoa::Architecture)3> *this,char *sequence,Graph *graph,
          uint64_t normal_matrix_width,uint64_t matrix_width,uint64_t matrix_height)

{
  undefined4 *puVar1;
  __mxxxi *palVar2;
  byte bVar3;
  char cVar4;
  char cVar5;
  AlignmentSubtype AVar6;
  AlignmentType AVar7;
  pointer ppNVar8;
  pointer ppNVar9;
  __mxxxi *palVar10;
  Node *pNVar11;
  pointer ppEVar12;
  long lVar13;
  undefined1 auVar14 [32];
  longlong lVar15;
  longlong lVar16;
  longlong lVar17;
  char cVar18;
  Implementation *pIVar20;
  int iVar21;
  pointer ppEVar22;
  const_iterator __begin5;
  ulong uVar23;
  byte bVar24;
  byte bVar25;
  byte bVar26;
  uint uVar27;
  long lVar28;
  byte bVar29;
  uint uVar30;
  const_iterator __end4;
  ulong uVar31;
  bool bVar32;
  __mxxxi alVar33;
  undefined1 auVar34 [32];
  type unpacked [8];
  longlong local_80;
  longlong lStack_78;
  longlong lStack_70;
  longlong lStack_68;
  int iVar19;
  
  bVar3 = (this->super_AlignmentEngine).m_;
  bVar26 = (this->super_AlignmentEngine).n_;
  bVar25 = (this->super_AlignmentEngine).q_;
  bVar24 = (char)bVar3 >> 7;
  bVar29 = (char)bVar25 >> 7;
  bVar24 = (bVar3 ^ bVar24) - bVar24;
  bVar29 = (bVar25 ^ bVar29) - bVar29;
  bVar25 = (char)bVar26 >> 7;
  bVar25 = (bVar26 ^ bVar25) - bVar25;
  bVar3 = (this->super_AlignmentEngine).g_;
  local_80 = 0;
  lStack_78 = 0;
  lStack_70 = 0;
  lStack_68 = 0;
  bVar26 = (char)bVar3 >> 7;
  bVar26 = (bVar3 ^ bVar26) - bVar26;
  if (bVar25 < bVar24) {
    bVar25 = bVar24;
  }
  if (bVar29 < bVar26) {
    bVar29 = bVar26;
  }
  if (bVar29 < bVar25) {
    bVar29 = bVar25;
  }
  for (uVar23 = 0; uVar23 < graph->num_codes_; uVar23 = uVar23 + 1) {
    uVar30 = 0;
    iVar21 = (graph->decoder_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start[uVar23 & 0xff];
    for (uVar27 = 0; uVar27 < matrix_width; uVar27 = uVar27 + 1) {
      cVar4 = (this->super_AlignmentEngine).m_;
      cVar5 = (this->super_AlignmentEngine).n_;
      uVar31 = (ulong)uVar30;
      for (lVar28 = 0; lVar28 != 0x20; lVar28 = lVar28 + 4) {
        iVar19 = -(uint)bVar29;
        if (uVar31 < normal_matrix_width) {
          cVar18 = cVar4;
          if (sequence[uVar31] != (char)iVar21) {
            cVar18 = cVar5;
          }
          iVar19 = (int)cVar18;
        }
        *(int *)((long)&local_80 + lVar28) = iVar19;
        uVar31 = uVar31 + 1;
      }
      uVar30 = uVar30 + 8;
      palVar10 = ((this->pimpl_)._M_t.
                  super___uniq_ptr_impl<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                  .
                  super__Head_base<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_false>
                 ._M_head_impl)->sequence_profile + uVar23 * matrix_width + (ulong)uVar27;
      (*palVar10)[0] = local_80;
      (*palVar10)[1] = lStack_78;
      (*palVar10)[2] = lStack_70;
      (*palVar10)[3] = lStack_68;
    }
  }
  ppNVar8 = (graph->rank_to_node_).
            super__Vector_base<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  ppNVar9 = (graph->rank_to_node_).
            super__Vector_base<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  pIVar20 = (this->pimpl_)._M_t.
            super___uniq_ptr_impl<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
            ._M_t.
            super__Tuple_impl<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
            .
            super__Head_base<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_false>
            ._M_head_impl;
  for (uVar27 = 0; (ulong)uVar27 < (ulong)((long)ppNVar9 - (long)ppNVar8 >> 3); uVar27 = uVar27 + 1)
  {
    *(uint *)(*(long *)&(pIVar20->node_id_to_rank).
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_> +
             (ulong)ppNVar8[uVar27]->id * 4) = uVar27;
  }
  AVar6 = (this->super_AlignmentEngine).subtype_;
  if (AVar6 != kAffine) {
    if (AVar6 != kConvex) goto LAB_00115bae;
    uVar23 = 1;
    uVar27 = 0;
    while( true ) {
      pIVar20 = (this->pimpl_)._M_t.
                super___uniq_ptr_impl<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                ._M_t.
                super__Tuple_impl<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                .
                super__Head_base<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_false>
                ._M_head_impl;
      uVar31 = (ulong)uVar27;
      if (matrix_width <= uVar31) break;
      palVar10 = pIVar20->O + uVar31;
      (*palVar10)[0] = -0x7ffffbff7ffffc00;
      (*palVar10)[1] = -0x7ffffbff7ffffc00;
      (*palVar10)[2] = -0x7ffffbff7ffffc00;
      (*palVar10)[3] = -0x7ffffbff7ffffc00;
      alVar33 = (__mxxxi)vpbroadcastd_avx512vl();
      ((this->pimpl_)._M_t.
       super___uniq_ptr_impl<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
       ._M_t.
       super__Tuple_impl<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
       .
       super__Head_base<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_false>
      ._M_head_impl)->Q[uVar31] = alVar33;
      auVar34 = vpbroadcastd_avx512vl();
      iVar21 = 7;
      while (bVar32 = iVar21 != 0, iVar21 = iVar21 + -1, bVar32) {
        auVar14 = vperm2i128_avx2(auVar34,auVar34,0x28);
        auVar34 = vpalignr_avx2(auVar34,auVar14,0xc);
        palVar10 = ((this->pimpl_)._M_t.
                    super___uniq_ptr_impl<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                    .
                    super__Head_base<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_false>
                   ._M_head_impl)->Q;
        alVar33 = (__mxxxi)vpaddd_avx2(auVar34,(undefined1  [32])palVar10[uVar31]);
        palVar10[uVar31] = alVar33;
      }
      uVar27 = uVar27 + 1;
    }
    puVar1 = (undefined4 *)
             (*(long *)&(pIVar20->first_column).super__Vector_base<int,_std::allocator<int>_>.
                        _M_impl + matrix_height * 8);
    *puVar1 = 0;
    ppNVar8 = (graph->rank_to_node_).
              super__Vector_base<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    for (; uVar23 < matrix_height; uVar23 = (ulong)((int)uVar23 + 1)) {
      iVar19 = (int)(this->super_AlignmentEngine).c_;
      pNVar11 = ppNVar8[(int)uVar23 - 1];
      iVar21 = (this->super_AlignmentEngine).q_ - iVar19;
      ppEVar22 = (pNVar11->inedges).
                 super__Vector_base<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      ppEVar12 = *(pointer *)
                  ((long)&(pNVar11->inedges).
                          super__Vector_base<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>
                          ._M_impl + 8);
      if (ppEVar22 != ppEVar12) {
        iVar21 = -0x7ffffc00;
      }
      for (; ppEVar22 != ppEVar12; ppEVar22 = ppEVar22 + 1) {
        if (iVar21 <= (int)puVar1[*(int *)(*(long *)&(pIVar20->node_id_to_rank).
                                                                                                          
                                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                          + (ulong)(*ppEVar22)->tail->id * 4) + 1]) {
          iVar21 = puVar1[*(int *)(*(long *)&(pIVar20->node_id_to_rank).
                                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                  + (ulong)(*ppEVar22)->tail->id * 4) + 1];
        }
      }
      puVar1[uVar23] = iVar21 + iVar19;
    }
  }
  uVar27 = 0;
  while( true ) {
    pIVar20 = (this->pimpl_)._M_t.
              super___uniq_ptr_impl<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
              ._M_t.
              super__Tuple_impl<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
              .
              super__Head_base<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_false>
              ._M_head_impl;
    uVar23 = (ulong)uVar27;
    if (matrix_width <= uVar23) break;
    palVar10 = pIVar20->F + uVar23;
    (*palVar10)[0] = -0x7ffffbff7ffffc00;
    (*palVar10)[1] = -0x7ffffbff7ffffc00;
    (*palVar10)[2] = -0x7ffffbff7ffffc00;
    (*palVar10)[3] = -0x7ffffbff7ffffc00;
    alVar33 = (__mxxxi)vpbroadcastd_avx512vl();
    ((this->pimpl_)._M_t.
     super___uniq_ptr_impl<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
     ._M_t.
     super__Tuple_impl<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
     .
     super__Head_base<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_false>
    ._M_head_impl)->E[uVar23] = alVar33;
    auVar34 = vpbroadcastd_avx512vl();
    iVar21 = 7;
    while (bVar32 = iVar21 != 0, iVar21 = iVar21 + -1, bVar32) {
      auVar14 = vperm2i128_avx2(auVar34,auVar34,0x28);
      auVar34 = vpalignr_avx2(auVar34,auVar14,0xc);
      palVar10 = ((this->pimpl_)._M_t.
                  super___uniq_ptr_impl<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                  .
                  super__Head_base<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_false>
                 ._M_head_impl)->E;
      alVar33 = (__mxxxi)vpaddd_avx2(auVar34,(undefined1  [32])palVar10[uVar23]);
      palVar10[uVar23] = alVar33;
    }
    uVar27 = uVar27 + 1;
  }
  puVar1 = (undefined4 *)
           (*(long *)&(pIVar20->first_column).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data + matrix_height * 4);
  *puVar1 = 0;
  ppNVar8 = (graph->rank_to_node_).
            super__Vector_base<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  for (uVar23 = 1; uVar23 < matrix_height; uVar23 = (ulong)((int)uVar23 + 1)) {
    iVar19 = (int)(this->super_AlignmentEngine).e_;
    pNVar11 = ppNVar8[(int)uVar23 - 1];
    iVar21 = (this->super_AlignmentEngine).g_ - iVar19;
    ppEVar22 = (pNVar11->inedges).
               super__Vector_base<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>._M_impl
               .super__Vector_impl_data._M_start;
    ppEVar12 = *(pointer *)
                ((long)&(pNVar11->inedges).
                        super__Vector_base<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>
                        ._M_impl + 8);
    if (ppEVar22 != ppEVar12) {
      iVar21 = -0x7ffffc00;
    }
    for (; ppEVar22 != ppEVar12; ppEVar22 = ppEVar22 + 1) {
      if (iVar21 <= (int)puVar1[*(int *)(*(long *)&(pIVar20->node_id_to_rank).
                                                                                                      
                                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                        + (ulong)(*ppEVar22)->tail->id * 4) + 1]) {
        iVar21 = puVar1[*(int *)(*(long *)&(pIVar20->node_id_to_rank).
                                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                + (ulong)(*ppEVar22)->tail->id * 4) + 1];
      }
    }
    puVar1[uVar23] = iVar21 + iVar19;
  }
LAB_00115bae:
  AVar7 = (this->super_AlignmentEngine).type_;
  if (AVar7 == kOV) {
    AVar6 = (this->super_AlignmentEngine).subtype_;
    if (AVar6 == kConvex) {
      uVar27 = 0;
      while (uVar23 = (ulong)uVar27, uVar23 < matrix_width) {
        pIVar20 = (this->pimpl_)._M_t.
                  super___uniq_ptr_impl<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                  .
                  super__Head_base<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_false>
                  ._M_head_impl;
        uVar27 = uVar27 + 1;
        alVar33 = (__mxxxi)vpmaxsd_avx2((undefined1  [32])pIVar20->E[uVar23],
                                        (undefined1  [32])pIVar20->Q[uVar23]);
        pIVar20->H[uVar23] = alVar33;
      }
    }
    else if (AVar6 == kAffine) {
      for (uVar27 = 0; uVar23 = (ulong)uVar27, uVar23 < matrix_width; uVar27 = uVar27 + 1) {
        pIVar20 = (this->pimpl_)._M_t.
                  super___uniq_ptr_impl<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                  .
                  super__Head_base<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_false>
                  ._M_head_impl;
        palVar10 = pIVar20->E + uVar23;
        lVar15 = (*palVar10)[1];
        lVar16 = (*palVar10)[2];
        lVar17 = (*palVar10)[3];
        palVar2 = pIVar20->H + uVar23;
        (*palVar2)[0] = (*palVar10)[0];
        (*palVar2)[1] = lVar15;
        (*palVar2)[2] = lVar16;
        (*palVar2)[3] = lVar17;
      }
    }
    else if (AVar6 == kLinear) {
      for (uVar27 = 0; uVar23 = (ulong)uVar27, uVar23 < matrix_width; uVar27 = uVar27 + 1) {
        alVar33 = (__mxxxi)vpbroadcastd_avx512vl();
        ((this->pimpl_)._M_t.
         super___uniq_ptr_impl<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
         ._M_t.
         super__Tuple_impl<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
         .
         super__Head_base<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_false>
        ._M_head_impl)->H[uVar23] = alVar33;
        auVar34 = vpbroadcastd_avx512vl();
        iVar21 = 7;
        while (bVar32 = iVar21 != 0, iVar21 = iVar21 + -1, bVar32) {
          auVar14 = vperm2i128_avx2(auVar34,auVar34,0x28);
          auVar34 = vpalignr_avx2(auVar34,auVar14,0xc);
          palVar10 = ((this->pimpl_)._M_t.
                      super___uniq_ptr_impl<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                      .
                      super__Head_base<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_false>
                     ._M_head_impl)->H;
          alVar33 = (__mxxxi)vpaddd_avx2(auVar34,(undefined1  [32])palVar10[uVar23]);
          palVar10[uVar23] = alVar33;
        }
      }
    }
    pIVar20 = (this->pimpl_)._M_t.
              super___uniq_ptr_impl<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
              ._M_t.
              super__Tuple_impl<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
              .
              super__Head_base<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_false>
              ._M_head_impl;
    for (uVar27 = 0; uVar27 < matrix_height; uVar27 = uVar27 + 1) {
      *(undefined4 *)
       (*(long *)&(pIVar20->first_column).super__Vector_base<int,_std::allocator<int>_>._M_impl +
       (ulong)uVar27 * 4) = 0;
    }
  }
  else if (AVar7 == kNW) {
    AVar6 = (this->super_AlignmentEngine).subtype_;
    if (AVar6 == kLinear) {
      puVar1 = (pIVar20->first_column).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      *puVar1 = 0;
      ppNVar8 = (graph->rank_to_node_).
                super__Vector_base<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
      cVar4 = (this->super_AlignmentEngine).g_;
      for (uVar23 = 1; uVar23 < matrix_height; uVar23 = (ulong)((int)uVar23 + 1)) {
        pNVar11 = ppNVar8[(int)uVar23 - 1];
        ppEVar22 = (pNVar11->inedges).
                   super__Vector_base<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>.
                   _M_impl.super__Vector_impl_data._M_start;
        ppEVar12 = *(pointer *)
                    ((long)&(pNVar11->inedges).
                            super__Vector_base<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>
                            ._M_impl + 8);
        iVar21 = -0x7ffffc00;
        if (ppEVar22 == ppEVar12) {
          iVar21 = 0;
        }
        for (; ppEVar22 != ppEVar12; ppEVar22 = ppEVar22 + 1) {
          if (iVar21 <= (int)puVar1[*(int *)(*(long *)&(pIVar20->node_id_to_rank).
                                                                                                              
                                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                  ._M_impl + (ulong)(*ppEVar22)->tail->id * 4) + 1])
          {
            iVar21 = puVar1[*(int *)(*(long *)&(pIVar20->node_id_to_rank).
                                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                               ._M_impl + (ulong)(*ppEVar22)->tail->id * 4) + 1];
          }
        }
        puVar1[uVar23] = iVar21 + cVar4;
      }
      for (uVar27 = 0; uVar23 = (ulong)uVar27, uVar23 < matrix_width; uVar27 = uVar27 + 1) {
        alVar33 = (__mxxxi)vpbroadcastd_avx512vl();
        ((this->pimpl_)._M_t.
         super___uniq_ptr_impl<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
         ._M_t.
         super__Tuple_impl<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
         .
         super__Head_base<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_false>
        ._M_head_impl)->H[uVar23] = alVar33;
        auVar34 = vpbroadcastd_avx512vl();
        iVar21 = 7;
        while (bVar32 = iVar21 != 0, iVar21 = iVar21 + -1, bVar32) {
          auVar14 = vperm2i128_avx2(auVar34,auVar34,0x28);
          auVar34 = vpalignr_avx2(auVar34,auVar14,0xc);
          palVar10 = ((this->pimpl_)._M_t.
                      super___uniq_ptr_impl<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                      .
                      super__Head_base<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_false>
                     ._M_head_impl)->H;
          alVar33 = (__mxxxi)vpaddd_avx2(auVar34,(undefined1  [32])palVar10[uVar23]);
          palVar10[uVar23] = alVar33;
        }
      }
    }
    else if (AVar6 == kConvex) {
      pIVar20 = (this->pimpl_)._M_t.
                super___uniq_ptr_impl<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                ._M_t.
                super__Tuple_impl<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                .
                super__Head_base<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_false>
                ._M_head_impl;
      for (uVar27 = 0; uVar23 = (ulong)uVar27, uVar23 < matrix_height; uVar27 = uVar27 + 1) {
        lVar13 = *(long *)&(pIVar20->first_column).super__Vector_base<int,_std::allocator<int>_>.
                           _M_impl;
        lVar28 = lVar13 + uVar23 * 4;
        iVar21 = *(int *)(lVar28 + matrix_height * 4);
        iVar19 = *(int *)(matrix_height * 8 + lVar28);
        if (iVar19 < iVar21) {
          iVar19 = iVar21;
        }
        *(int *)(lVar13 + uVar23 * 4) = iVar19;
      }
      uVar27 = 0;
      while (uVar23 = (ulong)uVar27, uVar23 < matrix_width) {
        pIVar20 = (this->pimpl_)._M_t.
                  super___uniq_ptr_impl<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                  .
                  super__Head_base<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_false>
                  ._M_head_impl;
        uVar27 = uVar27 + 1;
        alVar33 = (__mxxxi)vpmaxsd_avx2((undefined1  [32])pIVar20->E[uVar23],
                                        (undefined1  [32])pIVar20->Q[uVar23]);
        pIVar20->H[uVar23] = alVar33;
      }
    }
    else if (AVar6 == kAffine) {
      pIVar20 = (this->pimpl_)._M_t.
                super___uniq_ptr_impl<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                ._M_t.
                super__Tuple_impl<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                .
                super__Head_base<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_false>
                ._M_head_impl;
      for (uVar27 = 0; uVar27 < matrix_height; uVar27 = uVar27 + 1) {
        puVar1 = (undefined4 *)
                 (*(long *)&(pIVar20->first_column).super__Vector_base<int,_std::allocator<int>_>.
                            _M_impl + (ulong)uVar27 * 4);
        *puVar1 = puVar1[matrix_height];
      }
      for (uVar27 = 0; uVar23 = (ulong)uVar27, uVar23 < matrix_width; uVar27 = uVar27 + 1) {
        pIVar20 = (this->pimpl_)._M_t.
                  super___uniq_ptr_impl<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                  .
                  super__Head_base<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_false>
                  ._M_head_impl;
        palVar10 = pIVar20->E + uVar23;
        lVar15 = (*palVar10)[1];
        lVar16 = (*palVar10)[2];
        lVar17 = (*palVar10)[3];
        palVar2 = pIVar20->H + uVar23;
        (*palVar2)[0] = (*palVar10)[0];
        (*palVar2)[1] = lVar15;
        (*palVar2)[2] = lVar16;
        (*palVar2)[3] = lVar17;
      }
    }
  }
  else if (AVar7 == kSW) {
    uVar27 = 0;
    while( true ) {
      uVar23 = (ulong)uVar27;
      pIVar20 = (this->pimpl_)._M_t.
                super___uniq_ptr_impl<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                ._M_t.
                super__Tuple_impl<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                .
                super__Head_base<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_false>
                ._M_head_impl;
      if (matrix_width <= uVar23) break;
      uVar27 = uVar27 + 1;
      palVar10 = pIVar20->H + uVar23;
      (*palVar10)[0] = 0;
      (*palVar10)[1] = 0;
      (*palVar10)[2] = 0;
      (*palVar10)[3] = 0;
    }
    for (uVar27 = 0; uVar27 < matrix_height; uVar27 = uVar27 + 1) {
      *(undefined4 *)
       (*(long *)&(pIVar20->first_column).super__Vector_base<int,_std::allocator<int>_>._M_impl +
       (ulong)uVar27 * 4) = 0;
    }
  }
  return;
}

Assistant:

void SimdAlignmentEngine<A>::Initialize(
    const char* sequence,
    const Graph& graph,
    std::uint64_t normal_matrix_width,
    std::uint64_t matrix_width,
    std::uint64_t matrix_height) noexcept {
#if defined(__AVX2__) || defined(__SSE4_1__) || defined(SPOA_USE_SIMDE)
  std::int32_t padding_penatly = -1 * std::max(
      std::max(abs(m_), abs(n_)),
      std::max(abs(g_), abs(q_)));

  __attribute__((aligned(kRegisterSize / 8))) typename T::type unpacked[T::kNumVar] = {};  // NOLINT

  for (std::uint32_t i = 0; i < graph.num_codes(); ++i) {
    char c = graph.decoder(i);
    for (std::uint32_t j = 0; j < matrix_width; ++j) {
      for (std::uint32_t k = 0; k < T::kNumVar; ++k) {
        unpacked[k] = (j * T::kNumVar + k) < normal_matrix_width ?
            (c == sequence[j * T::kNumVar + k] ? m_ : n_) : padding_penatly;
      }
      pimpl_->sequence_profile[i * matrix_width + j] =
          _mmxxx_load_si(reinterpret_cast<const __mxxxi*>(unpacked));
    }
  }

  const auto& rank_to_node = graph.rank_to_node();
  for (std::uint32_t i = 0; i < rank_to_node.size(); ++i) {
    pimpl_->node_id_to_rank[rank_to_node[i]->id] = i;
  }

  typename T::type kNegativeInfinity =
      std::numeric_limits<typename T::type>::min() + 1024;

  __mxxxi negative_infinities = T::_mmxxx_set1_epi(kNegativeInfinity);
  __mxxxi zeroes = T::_mmxxx_set1_epi(0);

  // initialize secondary matrices
  switch (subtype_) {
    case AlignmentSubtype::kConvex:
      for (std::uint32_t j = 0; j < matrix_width; ++j) {
        pimpl_->O[j] = negative_infinities;
        pimpl_->Q[j] = T::_mmxxx_set1_epi(q_ + j * T::kNumVar * c_);

        __mxxxi c = T::_mmxxx_set1_epi(c_);
        for (std::uint32_t k = 1; k < T::kNumVar; ++k) {
          c = _mmxxx_slli_si(c, T::kLSS);
          pimpl_->Q[j] = T::_mmxxx_add_epi(pimpl_->Q[j], c);
        }
      }
      pimpl_->first_column[2 * matrix_height] = 0;
      for (std::uint32_t i = 1; i < matrix_height; ++i) {
        const auto& edges = rank_to_node[i - 1]->inedges;
        std::int32_t penalty = edges.empty() ? q_ - c_ : kNegativeInfinity;
        for (const auto& it : edges) {
          std::uint32_t pred_i = pimpl_->node_id_to_rank[it->tail->id] + 1;
          penalty = std::max(penalty, pimpl_->first_column[2 * matrix_height + pred_i]);  // NOLINT
        }
        pimpl_->first_column[2 * matrix_height + i] = penalty + c_;
      }
      // fall through
    case AlignmentSubtype::kAffine:
      for (std::uint32_t j = 0; j < matrix_width; ++j) {
        pimpl_->F[j] = negative_infinities;
        pimpl_->E[j] = T::_mmxxx_set1_epi(g_ + j * T::kNumVar * e_);

        __mxxxi e = T::_mmxxx_set1_epi(e_);
        for (std::uint32_t k = 1; k < T::kNumVar; ++k) {
          e = _mmxxx_slli_si(e, T::kLSS);
          pimpl_->E[j] = T::_mmxxx_add_epi(pimpl_->E[j], e);
        }
      }
      pimpl_->first_column[matrix_height] = 0;
      for (std::uint32_t i = 1; i < matrix_height; ++i) {
        const auto& edges = rank_to_node[i - 1]->inedges;
        std::int32_t penalty = edges.empty() ? g_ - e_ : kNegativeInfinity;
        for (const auto& it : edges) {
          std::uint32_t pred_i = pimpl_->node_id_to_rank[it->tail->id] + 1;
          penalty = std::max(penalty, pimpl_->first_column[matrix_height + pred_i]);  // NOLINT
        }
        pimpl_->first_column[matrix_height + i] = penalty + e_;
      }
      // fall through
    case AlignmentSubtype::kLinear:
      break;
    default:
      break;
  }

  // initialize primary matrix
  switch (type_) {
    case AlignmentType::kSW:
      for (std::uint32_t j = 0; j < matrix_width; ++j) {
        pimpl_->H[j] = zeroes;
      }
      for (std::uint32_t i = 0; i < matrix_height; ++i) {
        pimpl_->first_column[i] = 0;
      }
      break;
    case AlignmentType::kNW:
      switch (subtype_) {
        case AlignmentSubtype::kConvex:
          for (std::uint32_t i = 0; i < matrix_height; ++i) {
            pimpl_->first_column[i] = std::max(
                pimpl_->first_column[matrix_height + i],
                pimpl_->first_column[2 * matrix_height + i]);
          }
          for (std::uint32_t j = 0; j < matrix_width; ++j) {
            pimpl_->H[j] = T::_mmxxx_max_epi(pimpl_->E[j], pimpl_->Q[j]);
          }
          break;
        case AlignmentSubtype::kAffine:
          for (std::uint32_t i = 0; i < matrix_height; ++i) {
            pimpl_->first_column[i] = pimpl_->first_column[matrix_height + i];
          }
          for (std::uint32_t j = 0; j < matrix_width; ++j) {
            pimpl_->H[j] = pimpl_->E[j];
          }
          break;
        case AlignmentSubtype::kLinear:
          pimpl_->first_column[0] = 0;
          for (std::uint32_t i = 1; i < matrix_height; ++i) {
            const auto& edges = rank_to_node[i - 1]->inedges;
            std::int32_t penalty = edges.empty() ? 0 : kNegativeInfinity;
            for (const auto& it : edges) {
              std::uint32_t pred_i = pimpl_->node_id_to_rank[it->tail->id] + 1;
              penalty = std::max(penalty, pimpl_->first_column[pred_i]);
            }
            pimpl_->first_column[i] = penalty + g_;
          }
          for (std::uint32_t j = 0; j < matrix_width; ++j) {
            pimpl_->H[j] = T::_mmxxx_set1_epi(g_ + j * T::kNumVar * g_);
            __mxxxi g = T::_mmxxx_set1_epi(g_);

            for (std::uint32_t k = 1; k < T::kNumVar; ++k) {
              g = _mmxxx_slli_si(g, T::kLSS);
              pimpl_->H[j] = T::_mmxxx_add_epi(pimpl_->H[j], g);
            }
          }
        default:
          break;
      }
      break;
    case AlignmentType::kOV:
      switch (subtype_) {
        case AlignmentSubtype::kConvex:
          for (std::uint32_t j = 0; j < matrix_width; ++j) {
            pimpl_->H[j] = T::_mmxxx_max_epi(pimpl_->E[j],
            pimpl_->Q[j]);
          }
          break;
        case AlignmentSubtype::kAffine:
          for (std::uint32_t j = 0; j < matrix_width; ++j) {
            pimpl_->H[j] = pimpl_->E[j];
          }
          break;
        case AlignmentSubtype::kLinear:
          for (std::uint32_t j = 0; j < matrix_width; ++j) {
            pimpl_->H[j] = T::_mmxxx_set1_epi(g_ + j * T::kNumVar * g_);
            __mxxxi g = T::_mmxxx_set1_epi(g_);

            for (std::uint32_t k = 1; k < T::kNumVar; ++k) {
              g = _mmxxx_slli_si(g, T::kLSS);
              pimpl_->H[j] = T::_mmxxx_add_epi(pimpl_->H[j], g);
            }
          }
          break;
        default:
          break;
      }
      for (std::uint32_t i = 0; i < matrix_height; ++i) {
        pimpl_->first_column[i] = 0;
      }
      break;
    default:
      break;
  }
#endif
  (void) sequence;
  (void) graph;
  (void) normal_matrix_width;
  (void) matrix_width;
  (void) matrix_height;
}